

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

Iterator __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
::Iterator::operator++(Iterator *this,int param_2)

{
  size_t sVar1;
  
  if (this->offset < this->node_ptr->data_size - 1) {
    sVar1 = this->offset + 1;
  }
  else {
    this->node_ptr = this->node_ptr->next;
    sVar1 = 0;
  }
  this->offset = sVar1;
  return *this;
}

Assistant:

Iterator operator++(int) {
            Iterator temp = *this;
            if (offset < node_ptr->data_size - 1)
                offset++;
            else {
                node_ptr = node_ptr->next;
                offset = 0;
            }
            return temp;
        }